

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton10.cpp
# Opt level: O2

void __thiscall CDReporter<ComponentE>::~CDReporter(CDReporter<ComponentE> *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"destructor: ");
  poVar1 = std::operator<<(poVar1,"CDReporter<ComponentE>::~CDReporter() [T = ComponentE]");
  poVar1 = std::operator<<(poVar1," this: ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

~CDReporter() { std::cout << "destructor: " << __PRETTY_FUNCTION__ << " this: " << (void*)this << std::endl; }